

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

bool extractLine(string *line,string *text,int width,bool hyphenate,uint *offset)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  string local_150 [48];
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  int local_80;
  int local_7c;
  int last_character;
  int last_last_character;
  int local_58;
  int local_54;
  int line_width;
  int char_width;
  int character;
  uint last_ws;
  size_type bytes;
  size_type last_bytes;
  size_type last_last_bytes;
  uint *offset_local;
  bool hyphenate_local;
  string *psStack_20;
  int width_local;
  string *text_local;
  string *line_local;
  
  uVar1 = *offset;
  last_last_bytes = (size_type)offset;
  offset_local._3_1_ = hyphenate;
  offset_local._4_4_ = width;
  psStack_20 = text;
  text_local = line;
  uVar2 = std::__cxx11::string::length();
  if (uVar1 < uVar2) {
    bytes = (size_type)*(uint *)last_last_bytes;
    _character = (ulong)*(uint *)last_last_bytes;
    char_width = 0;
    local_54 = 0;
    local_58 = 0;
    while( true ) {
      last_bytes = bytes;
      bytes = _character;
      line_width = utf8_next_char(psStack_20,(size_type *)&character);
      if ((line_width == L'\0') || (line_width == L'\n')) break;
      if (line_width == L' ') {
        char_width = (int)bytes;
      }
      local_54 = mk_wcwidth(line_width);
      if (offset_local._4_4_ < local_58 + local_54) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_20);
        local_7c = (int)*pcVar3;
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_20);
        local_80 = (int)*pcVar3;
        if ((local_7c != 0x20) && (local_80 == 0x20)) {
          std::__cxx11::string::substr((ulong)local_a0,(ulong)psStack_20);
          std::__cxx11::string::operator=((string *)text_local,local_a0);
          std::__cxx11::string::~string(local_a0);
          *(int *)last_last_bytes = (int)bytes + 1;
          goto LAB_0017f147;
        }
        if (((local_7c == 0x20) && (local_80 != 0x20)) && (char_width != 0)) {
          std::__cxx11::string::substr((ulong)local_c0,(ulong)psStack_20);
          std::__cxx11::string::operator=((string *)text_local,local_c0);
          std::__cxx11::string::~string(local_c0);
          *(int *)last_last_bytes = (int)bytes;
          goto LAB_0017f147;
        }
        if ((local_7c != 0x20) && (local_80 != 0x20)) {
          if (char_width == 0) {
            if ((offset_local._3_1_ & 1) == 0) {
              std::__cxx11::string::substr((ulong)local_150,(ulong)psStack_20);
              std::__cxx11::string::operator=((string *)text_local,local_150);
              std::__cxx11::string::~string(local_150);
              *(int *)last_last_bytes = (int)bytes;
            }
            else {
              std::__cxx11::string::substr((ulong)local_120,(ulong)psStack_20);
              std::operator+(local_100,(char)local_120);
              std::__cxx11::string::operator=((string *)text_local,(string *)local_100);
              std::__cxx11::string::~string((string *)local_100);
              std::__cxx11::string::~string(local_120);
              *(int *)last_last_bytes = (int)last_bytes;
            }
          }
          else {
            std::__cxx11::string::substr((ulong)local_e0,(ulong)psStack_20);
            std::__cxx11::string::operator=((string *)text_local,local_e0);
            std::__cxx11::string::~string(local_e0);
            *(int *)last_last_bytes = char_width + 1;
          }
          goto LAB_0017f147;
        }
      }
      local_58 = local_54 + local_58;
    }
    std::__cxx11::string::substr((ulong)&last_character,(ulong)psStack_20);
    std::__cxx11::string::operator=((string *)text_local,(string *)&last_character);
    std::__cxx11::string::~string((string *)&last_character);
    *(int *)last_last_bytes = (int)_character;
LAB_0017f147:
    line_local._7_1_ = true;
  }
  else {
    line_local._7_1_ = false;
  }
  return line_local._7_1_;
}

Assistant:

bool extractLine (
  std::string& line,
  const std::string& text,
  int width,
  bool hyphenate,
  unsigned int& offset)
{
  // Terminate processing.
  // Note: bytes vs bytes.
  if (offset >= text.length ())
    return false;

  std::string::size_type last_last_bytes = offset;
  std::string::size_type last_bytes = offset;
  std::string::size_type bytes = offset;
  unsigned int last_ws = 0;
  int character;
  int char_width = 0;
  int line_width = 0;
  while (1)
  {
    last_last_bytes = last_bytes;
    last_bytes = bytes;
    character = utf8_next_char (text, bytes);

    if (character == 0 ||
        character == '\n')
    {
      line = text.substr (offset, last_bytes - offset);
      offset = bytes;
      break;
    }
    else if (character == ' ')
      last_ws = last_bytes;

    char_width = mk_wcwidth (character);
    if (line_width + char_width > width)
    {
      int last_last_character = text[last_last_bytes];
      int last_character = text[last_bytes];

      // [case 1] one| two --> last_last != 32, last == 32, ws == 0
      if (last_last_character != ' ' &&
          last_character      == ' ')
      {
        line = text.substr (offset, last_bytes - offset);
        offset = last_bytes + 1;
        break;
      }

      // [case 2] one |two --> last_last == 32, last != 32, ws != 0
      else if (last_last_character == ' ' &&
               last_character      != ' ' &&
               last_ws             != 0)
      {
        line = text.substr (offset, last_bytes - offset - 1);
        offset = last_bytes;
        break;
      }

      else if (last_last_character != ' ' &&
               last_character      != ' ')
      {
        // [case 3] one t|wo --> last_last != 32, last != 32, ws != 0
        if (last_ws != 0)
        {
          line = text.substr (offset, last_ws - offset);
          offset = last_ws + 1;
          break;
        }
        // [case 4] on|e two --> last_last != 32, last != 32, ws == 0
        else
        {
          if (hyphenate)
          {
            line = text.substr (offset, last_bytes - offset - 1) + '-';
            offset = last_last_bytes;
          }
          else
          {
            line = text.substr (offset, last_bytes - offset);
            offset = last_bytes;
          }
        }

        break;
      }
    }

    line_width += char_width;
  }

  return true;
}